

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,int _h,int _c)

{
  size_t sVar1;
  int in_ECX;
  ulong _elemsize;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  Mat tmp;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  Mat *pMVar2;
  int in_stack_ffffffffffffff94;
  Mat *in_stack_ffffffffffffff98;
  int local_30;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  
  if (in_RSI->w * in_RSI->h * in_RSI->c == in_EDX * in_ECX * in_R8D) {
    pMVar2 = in_RDI;
    if (in_RSI->dims < 3) {
      _elemsize = (long)in_EDX * (long)in_ECX;
      sVar1 = ncnn::alignSize((long)(in_EDX * in_ECX) * in_RSI->elemsize,0x10);
      if (_elemsize != sVar1 / in_RSI->elemsize) {
        Mat(in_RDI);
        create(in_RSI,(int)((ulong)pMVar2 >> 0x20),(int)pMVar2,(int)((ulong)in_RDI >> 0x20),
               _elemsize);
        for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 1) {
          memcpy((void *)((long)in_RDI->data + (long)local_30 * in_RDI->cstep * in_RDI->elemsize),
                 (void *)((long)in_RSI->data + (long)(local_30 * in_EDX * in_ECX) * in_RSI->elemsize
                         ),(long)(in_EDX * in_ECX) * in_RSI->elemsize);
        }
        return pMVar2;
      }
    }
    else if (in_RSI->c != in_R8D) {
      reshape(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      reshape((Mat *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffffe0,
              in_stack_ffffffffffffffdc);
      ~Mat((Mat *)0x129e57);
      return in_RDI;
    }
    Mat(in_RDI,in_RSI);
    in_RDI->dims = 3;
    in_RDI->w = in_EDX;
    in_RDI->h = in_ECX;
    in_RDI->c = in_R8D;
    sVar1 = ncnn::alignSize((long)(in_EDX * in_ECX) * in_RSI->elemsize,0x10);
    in_RDI->cstep = sVar1 / in_RSI->elemsize;
  }
  else {
    Mat(in_RDI);
    pMVar2 = in_RDI;
  }
  return pMVar2;
}

Assistant:

inline Mat Mat::reshape(int _w, int _h, int _c) const
{
    if (w * h * c != _w * _h * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h != alignSize(_w * _h * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _c, elemsize);

            // align channel
            for (int i=0; i<_c; i++)
            {
                const void* ptr = (unsigned char*)data + i * _w * _h * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, _w * _h * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _c);
        return tmp.reshape(_w, _h, _c);
    }

    Mat m = *this;

    m.dims = 3;
    m.w = _w;
    m.h = _h;
    m.c = _c;

    m.cstep = alignSize(_w * _h * elemsize, 16) / elemsize;

    return m;
}